

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket_skew.cpp
# Opt level: O1

void compute_skew<4u>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *name)

{
  int *piVar1;
  double dVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int *__s;
  pointer puVar9;
  pointer pdVar10;
  ostream *poVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  value_type *__val;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_var [56];
  undefined1 auVar21 [64];
  undefined1 in_XMM3 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_usage;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_max;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_min;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real_dists;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  allocator_type local_c1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  double local_70;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  string *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_50 = name;
  __s = (int *)operator_new(0x20000000);
  uVar12 = 0;
  memset(__s,0,0x20000000);
  do {
    iVar8 = 0;
    if (uVar12 < 0x800) {
      iVar15 = (int)uVar12;
      iVar8 = 0;
    }
    else {
      uVar18 = uVar12 & 0xffffffff;
      do {
        iVar15 = (int)(uVar18 >> 8);
        iVar8 = iVar8 + 0x7f8;
        uVar17 = (uint)uVar18;
        uVar18 = uVar18 >> 8;
      } while (0x7ffff < uVar17);
    }
    __s[uVar12] = iVar8 + iVar15;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x8000000);
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  iVar8 = *__s;
  local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_88,(iterator)0x0,(uint *)&local_c0);
  uVar17 = 1;
  lVar13 = 0;
  do {
    iVar15 = __s[lVar13 + 1];
    if (iVar15 != iVar8) {
      uVar16 = (uint)lVar13;
      if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar16;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_c0);
      }
      else {
        *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar16;
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar16 + 1;
      if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_c0);
      }
      else {
        *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish =
             (uint)local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = uVar17;
      if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_e8,
                   (iterator)
                   local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(uint *)&local_c0);
      }
      else {
        *local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar17;
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      uVar17 = 0;
    }
    uVar17 = uVar17 + 1;
    lVar13 = lVar13 + 1;
    iVar8 = iVar15;
  } while (lVar13 != 0x7ffffff);
  if (uVar17 != 0) {
    local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x7ffffff;
    if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_a8,
                 (iterator)
                 local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_c0);
    }
    else {
      *local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0x7ffffff;
      local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar17;
    if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_e8,
                 (iterator)
                 local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)&local_c0);
    }
    else {
      *local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = uVar17;
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_c0,
             (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_68);
  puVar9 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar13 = (long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)puVar9;
  if (lVar13 != 0) {
    lVar13 = lVar13 >> 2;
    lVar14 = 0;
    do {
      uVar17 = puVar9[lVar14];
      iVar15 = 0;
      uVar16 = uVar17;
      iVar8 = 0;
      if (0x7ff < uVar17) {
        do {
          uVar16 = uVar17 >> 8;
          iVar15 = iVar15 + 0x7f8;
          bVar4 = 0x7ffff < uVar17;
          uVar17 = uVar16;
          iVar8 = iVar15;
        } while (bVar4);
      }
      piVar1 = (int *)(CONCAT44(local_c0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                (uint)local_c0.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start) +
                      (ulong)(iVar8 + uVar16) * 4);
      *piVar1 = *piVar1 + 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar13 + (ulong)(lVar13 == 0));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_68,
           (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2,&local_c1);
  puVar9 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar9) {
    uVar12 = 0;
    do {
      uVar17 = puVar9[uVar12];
      iVar15 = 0;
      uVar16 = uVar17;
      iVar8 = 0;
      if (0x7ff < uVar17) {
        do {
          uVar16 = uVar17 >> 8;
          iVar15 = iVar15 + 0x7f8;
          bVar4 = 0x7ffff < uVar17;
          uVar17 = uVar16;
          iVar8 = iVar15;
        } while (bVar4);
      }
      uVar16 = iVar8 + uVar16;
      if (local_68.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_68.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        std::vector<double,_std::allocator<double>_>::resize
                  (local_68.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar16,
                   (ulong)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar16]);
      }
      uVar17 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12] -
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16];
      pdVar10 = local_68.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar10[uVar17] = pdVar10[uVar17] + 1.0;
      uVar12 = uVar12 + 1;
      puVar9 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar12 < (ulong)((long)(input->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2))
    ;
  }
  if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar12 = 0;
    do {
      if (*(int *)(CONCAT44(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) + uVar12 * 4) != 0) {
        auVar20 = vcvtusi2sd_avx512f(in_XMM3,local_e8.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar12]);
        auVar21 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        local_48 = log2(1.0 / auVar20._0_8_);
        auVar20 = auVar21._0_16_;
        pdVar10 = local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uStack_40 = extraout_XMM0_Qb;
        if (local_68.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar12].
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish == pdVar10) {
          local_70 = 0.0;
        }
        else {
          local_70 = 0.0;
          uVar18 = 0;
          do {
            dVar2 = pdVar10[uVar18];
            if ((dVar2 != 0.0) || (NAN(dVar2))) {
              auVar20 = vcvtusi2sd_avx512f(in_XMM3,*(undefined4 *)
                                                    (CONCAT44(local_c0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (uint)local_c0.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                                  uVar12 * 4));
              auVar21._0_8_ = log2(dVar2 / auVar20._0_8_);
              auVar21._8_56_ = extraout_var;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = local_70;
              auVar20._8_8_ = 0;
              auVar20._0_8_ =
                   local_68.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
              auVar20 = vfnmadd231sd_fma(auVar19,auVar21._0_16_,auVar20);
              auVar21 = ZEXT1664(auVar20);
              local_70 = auVar20._0_8_;
            }
            auVar20 = auVar21._0_16_;
            uVar18 = uVar18 + 1;
            pdVar10 = local_68.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar12].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar18 < (ulong)((long)local_68.
                                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar12].
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_finish - (long)pdVar10
                                   >> 3));
        }
        uVar3 = *(undefined4 *)
                 (CONCAT44(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           (uint)local_c0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start) + uVar12 * 4);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,(local_50->_M_dataplus)._M_p,
                             local_50->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
        auVar7._8_8_ = uStack_40;
        auVar7._0_8_ = local_48;
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar19 = vxorpd_avx512vl(auVar7,auVar5);
        auVar20 = vcvtusi2sd_avx512f(auVar20,uVar3);
        poVar11 = std::ostream::_M_insert<double>(auVar19._0_8_ - local_70 / auVar20._0_8_);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)local_e8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_e8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_68);
  pvVar6 = (void *)CONCAT44(local_c0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            (uint)local_c0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_c0.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  if (local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(__s,0x20000000);
  return;
}

Assistant:

void compute_skew(std::vector<uint32_t>& input, std::string name)
{
    std::vector<uint32_t> bucket_map(1 << 27);
    for (size_t i = 0; i < bucket_map.size(); i++) {
        bucket_map[i] = compute_bucket<fidelity>(i);
    }
    std::vector<uint32_t> bucket_sizes;
    std::vector<uint32_t> bucket_min;
    std::vector<uint32_t> bucket_max;
    uint32_t prev = bucket_map[0];
    bucket_min.push_back(0);
    auto cur_size = 1;
    for (size_t i = 1; i < bucket_map.size(); i++) {
        auto cur = bucket_map[i];
        if (cur != prev) {
            bucket_max.push_back(i - 1);
            bucket_min.push_back(i);
            bucket_sizes.push_back(cur_size);
            cur_size = 0;
        }
        cur_size++;
        prev = cur;
    }
    if (cur_size) {
        bucket_max.push_back(bucket_map.size() - 1);
        bucket_sizes.push_back(cur_size);
    }

    std::vector<uint32_t> bucket_usage(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        bucket_usage[bucket_id]++;
    }

    std::vector<std::vector<double>> real_dists(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        if (real_dists[bucket_id].size() == 0)
            real_dists[bucket_id].resize(bucket_sizes[bucket_id]);
        auto bucket_offset = input[i] - bucket_min[bucket_id];
        real_dists[bucket_id][bucket_offset] += 1.0;
    }
    size_t usage_cum_sum = 0;
    for (size_t i = 0; i < bucket_sizes.size(); i++) {
        if (bucket_usage[i] != 0) {
            double bits_uniform = -log2(double(1.0) / double(bucket_sizes[i]));
            double bits_real = 0.0;
            for (size_t j = 0; j < real_dists[i].size(); j++) {
                if (real_dists[i][j] != 0.0) {
                    double bits
                        = -log2(real_dists[i][j] / double(bucket_usage[i]));
                    bits_real += real_dists[i][j] * bits;
                }
            }
            bits_real /= double(bucket_usage[i]);
            usage_cum_sum += bucket_usage[i];
            std::cout << name << ";" << i << ";" << fidelity << ";"
                      << bucket_min[i] << ";" << bucket_max[i] << ";"
                      << bucket_sizes[i] << ";" << bucket_usage[i] << ";"
                      << usage_cum_sum << ";" << input.size() << ";"
                      << (bits_uniform - bits_real) << std::endl;
        }
    }
}